

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

ThrowRef * __thiscall MixedArena::alloc<wasm::ThrowRef>(MixedArena *this)

{
  ThrowRef *pTVar1;
  
  pTVar1 = (ThrowRef *)allocSpace(this,0x18,8);
  (pTVar1->super_SpecificExpression<(wasm::Expression::Id)56>).super_Expression._id = ThrowRefId;
  (pTVar1->super_SpecificExpression<(wasm::Expression::Id)56>).super_Expression.type.id = 0;
  return pTVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }